

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barray.c
# Opt level: O3

void bit_array_set_range(void *array,size_t bit,size_t count)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((count != 0 && array != (void *)0x0) && (uVar2 = *array, bit < uVar2)) {
    uVar3 = count + bit;
    if (uVar3 <= uVar2) {
      uVar2 = uVar3;
    }
    if (bit < uVar3) {
      do {
        pbVar1 = (byte *)((long)array + (bit >> 3) + 8);
        *pbVar1 = *pbVar1 | '\x01' << ((byte)bit & 7);
        bit = bit + 1;
      } while (bit < uVar2);
    }
  }
  return;
}

Assistant:

void bit_array_set_range(void * array, size_t bit, size_t count)
{
    if (array && count)
    {
        size_t * size = (size_t *) array;
        if (bit < *size)
        {
            unsigned char * ptr = (unsigned char *)(size + 1);
            size_t i;
            for (i = bit; i < *size && i < bit + count; ++i)
                ptr[i >> 3] |= (1U << (i & 7));
        }
    }
}